

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O3

void __thiscall FTraceInfo::EnterLinePortal(FTraceInfo *this,FPathTraverse *pt,intercept_t *in)

{
  bool *pbVar1;
  line_t_conflict *src;
  FTraceResults *pFVar2;
  double dVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  subsector_t *psVar7;
  FLinePortal *pFVar8;
  double dVar9;
  double dVar10;
  double local_68;
  double dStack_60;
  double local_58 [2];
  double local_48;
  double dStack_40;
  
  src = (in->d).line;
  pFVar8 = linePortals.Array + src->portalindex;
  if (linePortals.Count <= src->portalindex) {
    pFVar8 = (FLinePortal *)0x0;
  }
  dVar3 = in->frac + 1.52587890625e-05;
  dVar10 = in->frac * this->MaxDist;
  dVar9 = this->MaxDist * dVar3;
  local_68 = dVar10 * (this->Vec).X + (this->Start).X;
  dStack_60 = dVar10 * (this->Vec).Y + (this->Start).Y;
  dVar10 = (this->Vec).Z * dVar10 + (this->Start).Z;
  local_58[0] = dVar10;
  local_48 = local_68;
  dStack_40 = dStack_60;
  P_TranslatePortalXY(src,(double *)this,&(this->Start).Y);
  P_TranslatePortalZ(src,&(this->Start).Z);
  P_TranslatePortalVXVY(src,&(this->Vec).X,&(this->Vec).Y);
  P_TranslatePortalZ(src,&this->limitz);
  psVar7 = P_PointInSubsector((this->Vec).X * dVar9 + (this->Start).X,
                              (this->Vec).Y * dVar9 + (this->Start).Y);
  this->CurSector = psVar7->sector;
  this->EnterDist = dVar9;
  this->inshootthrough = 1;
  this->startfrac = dVar3;
  pbVar1 = &this->Results->unlinked;
  *pbVar1 = (bool)(*pbVar1 | pFVar8->mType != '\x03');
  FPathTraverse::PortalRelocate(pt,in,this->ptflags,(DVector3 *)0x0);
  if (((this->TraceFlags & 0x10) != 0) &&
     (this->TraceCallback != (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0)) {
    pFVar2 = this->Results;
    pFVar2->HitType = TRACE_CrossingPortal;
    (pFVar2->HitPos).Z = dVar10;
    (pFVar2->HitPos).X = local_48;
    (pFVar2->HitPos).Y = dStack_40;
    P_TranslatePortalXY(src,&local_68,&dStack_60);
    P_TranslatePortalZ(src,local_58);
    pFVar2 = this->Results;
    (pFVar2->SrcFromTarget).Z = local_58[0];
    (pFVar2->SrcFromTarget).X = local_68;
    (pFVar2->SrcFromTarget).Y = dStack_60;
    (pFVar2->HitVector).Z = (this->Vec).Z;
    uVar4 = *(undefined4 *)((long)&(this->Vec).X + 4);
    uVar5 = *(undefined4 *)&(this->Vec).Y;
    uVar6 = *(undefined4 *)((long)&(this->Vec).Y + 4);
    *(undefined4 *)&(pFVar2->HitVector).X = *(undefined4 *)&(this->Vec).X;
    *(undefined4 *)((long)&(pFVar2->HitVector).X + 4) = uVar4;
    *(undefined4 *)&(pFVar2->HitVector).Y = uVar5;
    *(undefined4 *)((long)&(pFVar2->HitVector).Y + 4) = uVar6;
    (*this->TraceCallback)(pFVar2,this->TraceCallbackData);
  }
  return;
}

Assistant:

void FTraceInfo::EnterLinePortal(FPathTraverse &pt, intercept_t *in)
{
	line_t *li = in->d.line;
	FLinePortal *port = li->getPortal();

	double frac = in->frac + EQUAL_EPSILON;
	double enterdist = MaxDist * frac;
	DVector3 exit = Start + MaxDist * in->frac * Vec;

	P_TranslatePortalXY(li, Start.X, Start.Y);
	P_TranslatePortalZ(li, Start.Z);
	P_TranslatePortalVXVY(li, Vec.X, Vec.Y);
	P_TranslatePortalZ(li, limitz);

	CurSector = P_PointInSector(Start + enterdist * Vec);
	EnterDist = enterdist;
	inshootthrough = true;
	startfrac = frac;
	Results->unlinked |= (port->mType != PORTT_LINKED);
	pt.PortalRelocate(in, ptflags);

	if ((TraceFlags & TRACE_ReportPortals) && TraceCallback != NULL)
	{
		enterdist = MaxDist * in->frac;
		Results->HitType = TRACE_CrossingPortal;
		Results->HitPos = exit;
		P_TranslatePortalXY(li, exit.X, exit.Y);
		P_TranslatePortalZ(li, exit.Z);
		Results->SrcFromTarget = exit;
		Results->HitVector = Vec;
		TraceCallback(*Results, TraceCallbackData);
	}
}